

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

tjscalingfactor * tjGetScalingFactors(int *numscalingfactors)

{
  undefined4 *in_RDI;
  long *in_FS_OFFSET;
  tjscalingfactor *local_8;
  
  if (in_RDI == (undefined4 *)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"tjGetScalingFactors(): Invalid argument");
    local_8 = (tjscalingfactor *)0x0;
  }
  else {
    *in_RDI = 0x10;
    local_8 = sf;
  }
  return local_8;
}

Assistant:

DLLEXPORT tjscalingfactor *tjGetScalingFactors(int *numscalingfactors)
{
  if (numscalingfactors == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjGetScalingFactors(): Invalid argument");
    return NULL;
  }

  *numscalingfactors = NUMSF;
  return (tjscalingfactor *)sf;
}